

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O3

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::putn<pstore::gsl::span<char_const,_1l>>
          (database_writer_policy *this,span<const_char,__1L> sp)

{
  span<const_char,__1L> local_78;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_68;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_58;
  pair<std::shared_ptr<char>,_pstore::typed_address<char>_> local_48;
  
  local_78.storage_.data_ = sp.storage_.data_;
  local_78.storage_.super_extent_type<_1L> = sp.storage_.super_extent_type<_1L>.size_;
  if (-1 < local_78.storage_.super_extent_type<_1L>.size_) {
    transaction_base::alloc_rw<char,void>
              (&local_48,this->transaction_,local_78.storage_.super_extent_type<_1L>.size_);
    gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
              (&local_58,&local_78,0);
    gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
              (&local_68,&local_78,local_78.storage_.super_extent_type<_1L>.size_);
    std::copy<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>,char*>
              (&local_58,&local_68,
               local_48.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (local_48.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.first.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return (result_type)(value_type)local_48.second.a_.a_;
  }
  assert_failed("t >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0x78);
}

Assistant:

auto putn (Span sp) -> result_type {
                        using element_type =
                            typename std::remove_const<typename Span::element_type>::type;

                        std::shared_ptr<element_type> ptr;
                        auto addr = typed_address<element_type>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<element_type> (
                            unsigned_cast (sp.size ()));
                        std::copy (std::begin (sp), std::end (sp), ptr.get ());
                        return addr.to_address ();
                    }